

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::ResultBuilder::
binary_assert<0,std::vector<MockStruct,std::allocator<MockStruct>>,std::vector<MockStruct,std::allocator<MockStruct>>>
          (ResultBuilder *this,vector<MockStruct,_std::allocator<MockStruct>_> *lhs,
          vector<MockStruct,_std::allocator<MockStruct>_> *rhs)

{
  bool bVar1;
  ContextOptions *pCVar2;
  RelationalComparator<0,_std::vector<MockStruct,_std::allocator<MockStruct>_>,_std::vector<MockStruct,_std::allocator<MockStruct>_>_>
  *in_RDI;
  vector<MockStruct,_std::allocator<MockStruct>_> *in_stack_00000028;
  char *in_stack_00000030;
  vector<MockStruct,_std::allocator<MockStruct>_> *in_stack_00000038;
  vector<MockStruct,_std::allocator<MockStruct>_> *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb8;
  String *in_stack_ffffffffffffffc0;
  
  bVar1 = RelationalComparator<0,_std::vector<MockStruct,_std::allocator<MockStruct>_>,_std::vector<MockStruct,_std::allocator<MockStruct>_>_>
          ::operator()(in_RDI,in_stack_ffffffffffffffa8,
                       (vector<MockStruct,_std::allocator<MockStruct>_> *)0x14ec11);
  in_RDI[0x28] = (RelationalComparator<0,_std::vector<MockStruct,_std::allocator<MockStruct>_>,_std::vector<MockStruct,_std::allocator<MockStruct>_>_>
                  )((bVar1 ^ 0xffU) & 1);
  if ((((byte)in_RDI[0x28] & 1) == 0) && (pCVar2 = getContextOptions(), (pCVar2->success & 1U) == 0)
     ) {
    return;
  }
  stringifyBinaryExpr<std::vector<MockStruct,std::allocator<MockStruct>>,std::vector<MockStruct,std::allocator<MockStruct>>>
            (in_stack_00000038,in_stack_00000030,in_stack_00000028);
  String::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  String::~String(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }